

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall tcu::TextureLevelPyramid::clearLevel(TextureLevelPyramid *this,int levelNdx)

{
  reference this_00;
  reference __dest;
  PixelBufferAccess local_40;
  int local_14;
  TextureLevelPyramid *pTStack_10;
  int levelNdx_local;
  TextureLevelPyramid *this_local;
  
  local_14 = levelNdx;
  pTStack_10 = this;
  this_00 = std::
            vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
            ::operator[](&this->m_data,(long)levelNdx);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::clear(this_00);
  PixelBufferAccess::PixelBufferAccess(&local_40);
  __dest = std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::operator[]
                     (&this->m_access,(long)local_14);
  memcpy(__dest,&local_40,0x28);
  return;
}

Assistant:

void TextureLevelPyramid::clearLevel (int levelNdx)
{
	DE_ASSERT(!isLevelEmpty(levelNdx));

	m_data[levelNdx].clear();
	m_access[levelNdx] = PixelBufferAccess();
}